

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate_tz.cpp
# Opt level: O1

PosixZone * __thiscall
anon_unknown.dwarf_13d8a16::PosixZone::parse
          (PosixZone *__return_storage_ptr__,PosixZone *this,char **pos,char *end)

{
  char cVar1;
  char16_t *pcVar2;
  qsizetype qVar3;
  bool bVar4;
  int iVar5;
  void *pvVar6;
  Data *pDVar7;
  int iVar8;
  Data *pDVar9;
  Data *end_00;
  Data *pDVar10;
  long lVar11;
  Data *pDVar12;
  long in_FS_OFFSET;
  QByteArrayView ba;
  QLatin1StringView rhs;
  QLatin1StringView rhs_00;
  QStringView lhs;
  QStringView lhs_00;
  QString local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pDVar7 = (this->name).d.d;
  if (*(char *)&(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> == '<') {
    pDVar7 = (Data *)((long)&(pDVar7->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1);
    pDVar12 = pDVar7;
    pDVar10 = pDVar7;
    if (pDVar7 < pos) {
      do {
        pDVar12 = pDVar10;
        if (*(char *)&(pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int> == '>')
        break;
        pDVar10 = (Data *)((long)&(pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          + 1);
        pDVar12 = (Data *)pos;
      } while (pDVar10 != (Data *)pos);
    }
    pDVar10 = (Data *)((long)&(pDVar12->super_QArrayData).ref_._q_value.super___atomic_base<int> + 1
                      );
  }
  else {
    pDVar10 = pDVar7;
    pDVar9 = pDVar7;
    pDVar12 = pDVar7;
    if (pDVar7 < pos) {
      do {
        pDVar10 = pDVar9;
        pDVar12 = pDVar9;
        if (0x19 < (byte)((*(byte *)&(pDVar9->super_QArrayData).ref_._q_value.
                                     super___atomic_base<int> | 0x20) + 0x9f)) break;
        pDVar9 = (Data *)((long)&(pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int> +
                         1);
        pDVar10 = (Data *)pos;
        pDVar12 = (Data *)pos;
      } while (pDVar9 != (Data *)pos);
    }
  }
  (this->name).d.d = pDVar10;
  if ((long)pDVar12 - (long)pDVar7 < 3) {
    (__return_storage_ptr__->name).d.d = (Data *)0x0;
    (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
    (__return_storage_ptr__->name).d.size = 0;
    __return_storage_ptr__->offset = -0x80000000;
  }
  else {
    pDVar9 = pDVar10;
    if ((pDVar10 < pos) &&
       ((cVar1 = *(char *)&(pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>,
        cVar1 == '-' || (cVar1 == '+')))) {
      pDVar9 = (Data *)((long)&(pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int> +
                       1);
    }
    end_00 = pDVar9;
    if (pDVar9 < pos) {
      lVar11 = (long)pos - (long)pDVar9;
      do {
        pvVar6 = memchr("0123456789:",
                        (int)*(char *)&(pDVar9->super_QArrayData).ref_._q_value.
                                       super___atomic_base<int>,0xc);
        end_00 = pDVar9;
        if (pvVar6 == (void *)0x0) break;
        pDVar9 = (Data *)((long)&(pDVar9->super_QArrayData).ref_._q_value.super___atomic_base<int> +
                         1);
        lVar11 = lVar11 + -1;
        end_00 = (Data *)pos;
      } while (lVar11 != 0);
    }
    local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
    ba.m_data = end;
    ba.m_size = (qsizetype)pDVar7;
    QString::fromUtf8(&local_58,(QString *)((long)pDVar12 - (long)pDVar7),ba);
    iVar8 = -0x80000000;
    if (pDVar10 < end_00) {
      cVar1 = *(char *)&(pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>;
      if (cVar1 == '-') {
        pDVar10 = (Data *)((long)&(pDVar10->super_QArrayData).ref_._q_value.super___atomic_base<int>
                          + 1);
        bVar4 = false;
      }
      else {
        bVar4 = true;
        if (cVar1 == '+') {
          pDVar10 = (Data *)((long)&(pDVar10->super_QArrayData).ref_._q_value.
                                    super___atomic_base<int> + 1);
        }
      }
      iVar5 = parsePosixTime((char *)pDVar10,(char *)end_00);
      iVar8 = -iVar5;
      if (!bVar4) {
        iVar8 = iVar5;
      }
    }
    (this->name).d.d = end_00;
    if (((iVar8 == 0) || ((undefined1 *)local_58.d.size != (undefined1 *)0x3)) ||
       ((rhs.m_data = "UTC", rhs.m_size = 3, lhs.m_data = local_58.d.ptr, lhs.m_size = 3,
        bVar4 = QtPrivate::equalStrings(lhs,rhs), !bVar4 &&
        (rhs_00.m_data = "GMT", rhs_00.m_size = 3, lhs_00.m_data = local_58.d.ptr, lhs_00.m_size = 3
        , bVar4 = QtPrivate::equalStrings(lhs_00,rhs_00), !bVar4)))) {
      qVar3 = local_58.d.size;
      pcVar2 = local_58.d.ptr;
      pDVar7 = local_58.d.d;
      local_58.d.d = (Data *)0x0;
      local_58.d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->name).d.d = pDVar7;
      (__return_storage_ptr__->name).d.ptr = pcVar2;
      local_58.d.size = 0;
      (__return_storage_ptr__->name).d.size = qVar3;
    }
    else {
      (__return_storage_ptr__->name).d.d = (Data *)0x0;
      (__return_storage_ptr__->name).d.ptr = (char16_t *)0x0;
      (__return_storage_ptr__->name).d.size = 0;
      iVar8 = -0x80000000;
    }
    __return_storage_ptr__->offset = iVar8;
    if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
      LOCK();
      ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
           ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
    __stack_chk_fail();
  }
  return __return_storage_ptr__;
}

Assistant:

PosixZone PosixZone::parse(const char *&pos, const char *end)
{
    static const char offsetChars[] = "0123456789:";

    const char *nameBegin = pos;
    const char *nameEnd;
    Q_ASSERT(pos < end);

    if (*pos == '<') {
        ++nameBegin;    // skip the '<'
        nameEnd = nameBegin;
        while (nameEnd < end && *nameEnd != '>') {
            // POSIX says only alphanumeric, but we allow anything
            ++nameEnd;
        }
        pos = nameEnd + 1;      // skip the '>'
    } else {
        nameEnd = nameBegin;
        while (nameEnd < end && asciiIsLetter(*nameEnd))
            ++nameEnd;
        pos = nameEnd;
    }
    if (nameEnd - nameBegin < 3)
        return {};  // name must be at least 3 characters long

    // zone offset, form [+-]hh:mm:ss
    const char *zoneBegin = pos;
    const char *zoneEnd = pos;
    if (zoneEnd < end && (zoneEnd[0] == '+' || zoneEnd[0] == '-'))
        ++zoneEnd;
    while (zoneEnd < end) {
        if (strchr(offsetChars, char(*zoneEnd)) == nullptr)
            break;
        ++zoneEnd;
    }

    QString name = QString::fromUtf8(nameBegin, nameEnd - nameBegin);
    const int offset = zoneEnd > zoneBegin ? parsePosixOffset(zoneBegin, zoneEnd) : InvalidOffset;
    pos = zoneEnd;
    // UTC+hh:mm:ss or GMT+hh:mm:ss should be read as offsets from UTC, not as a
    // POSIX rule naming a zone as UTC or GMT and specifying a non-zero offset.
    if (offset != 0 && (name =="UTC"_L1 || name == "GMT"_L1))
        return {};
    return {std::move(name), offset};
}